

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O0

void __thiscall brotli::ZopfliCostModel::~ZopfliCostModel(ZopfliCostModel *this)

{
  ZopfliCostModel *this_local;
  
  std::vector<double,_std::allocator<double>_>::~vector(&this->literal_costs_);
  std::vector<double,_std::allocator<double>_>::~vector(&this->cost_dist_);
  std::vector<double,_std::allocator<double>_>::~vector(&this->cost_cmd_);
  return;
}

Assistant:

ZopfliCostModel() : min_cost_cmd_(kInfinity) {}